

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntaxAnalysis.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* condition(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *__return_storage_ptr__,function *fn,string *label,
           vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *intermediateInner)

{
  tokenCategory op;
  int iVar1;
  long lVar2;
  reference pvVar3;
  reference __x;
  ulong __n;
  string vt2;
  string local_90;
  string vt1;
  string local_50;
  
  lVar2 = (long)intermediateCodeInner_abi_cxx11_.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)intermediateCodeInner_abi_cxx11_.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  vt1._M_dataplus._M_p = (pointer)&vt1.field_2;
  vt1._M_string_length = 0;
  vt1.field_2._M_local_buf[0] = '\0';
  iVar1 = expression(fn,&vt1);
  if (iVar1 == 2) {
    pvVar3 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::at(&formerAns_abi_cxx11_,
                  ~(long)tokenPointer +
                  ((long)formerAns_abi_cxx11_.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)formerAns_abi_cxx11_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x28);
    std::__cxx11::to_string(&local_90,pvVar3->second);
    std::operator+(&vt2,&local_90," f");
    error_syntax(&vt2);
    std::__cxx11::string::~string((string *)&vt2);
    std::__cxx11::string::~string((string *)&local_90);
  }
  getToken();
  op = Token;
  getToken();
  vt2._M_dataplus._M_p = (pointer)&vt2.field_2;
  vt2._M_string_length = 0;
  vt2.field_2._M_local_buf[0] = '\0';
  iVar1 = expression(fn,&vt2);
  if (iVar1 == 2) {
    pvVar3 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::at(&formerAns_abi_cxx11_,
                  ~(long)tokenPointer +
                  ((long)formerAns_abi_cxx11_.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)formerAns_abi_cxx11_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x28);
    std::__cxx11::to_string(&local_50,pvVar3->second);
    std::operator+(&local_90,&local_50," f");
    error_syntax(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  __n = (ulong)(int)(lVar2 / 0x18);
  while( true ) {
    if ((ulong)(((long)intermediateCodeInner_abi_cxx11_.
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)intermediateCodeInner_abi_cxx11_.
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= __n) break;
    __x = std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::at(&intermediateCodeInner_abi_cxx11_,__n);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back(intermediateInner,__x);
    __n = __n + 1;
  }
  addCondition(__return_storage_ptr__,&vt1,&vt2,label,op);
  std::__cxx11::string::~string((string *)&vt2);
  std::__cxx11::string::~string((string *)&vt1);
  return __return_storage_ptr__;
}

Assistant:

vector<string>
condition(function &fn, string &label, vector<vector<string>> &intermediateInner) {//条件
    int pos1 = intermediateCodeInner.size();
    string vt1;
    if (expressTypeEqual(expression(fn, vt1), CHARTK)) {
        error_syntax(to_string(formerAns.at(formerAns.size() - 1 - tokenPointer).second) + " f");
    }
    getToken();//isRelation();
    enum tokenCategory relation = Token;
    getToken();
    string vt2;
    if (expressTypeEqual(expression(fn, vt2), CHARTK)) {
        error_syntax(to_string(formerAns.at(formerAns.size() - 1 - tokenPointer).second) + " f");
    }
    for (int i = pos1; i < intermediateCodeInner.size(); i++) {
        intermediateInner.push_back(intermediateCodeInner.at(i));
    }
    //outputAns.emplace_back(syntaxCategoryString[23]);
    return addCondition(vt1, vt2, label, relation);
}